

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O2

uint NULLC::GetInstructionFromAddress(uintptr_t address)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = *(int *)(currExecutor + 0x1504) - 1;
  uVar5 = 0;
  uVar3 = 0;
  while (uVar2 = (uint)uVar3, uVar5 <= uVar4) {
    uVar2 = uVar4 + uVar5 >> 1;
    uVar3 = (ulong)uVar2;
    uVar1 = *(ulong *)(*(long *)(currExecutor + 0x14f8) + uVar3 * 8);
    if (address < uVar1) {
      uVar4 = uVar2 - 1;
    }
    else {
      if (address <= uVar1) break;
      uVar5 = uVar2 + 1;
    }
  }
  if (uVar2 != 0) {
    return uVar2 - (address < *(ulong *)(*(long *)(currExecutor + 0x14f8) + (ulong)uVar2 * 8));
  }
  return 0;
}

Assistant:

unsigned GetInstructionFromAddress(uintptr_t address)
	{
		unsigned lowerBound = 0;
		unsigned upperBound = currExecutor->instAddress.size() - 1;
		unsigned index = 0;

		while(lowerBound <= upperBound)
		{
			index = (lowerBound + upperBound) >> 1;

			if(address < uintptr_t(currExecutor->instAddress.data[index]))
				upperBound = index - 1;
			else if(address > uintptr_t(currExecutor->instAddress.data[index]))
				lowerBound = index + 1;
			else
				break;
		}

		if(index != 0 && address < uintptr_t(currExecutor->instAddress.data[index]))
			index--;

		return index;
	}